

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<long>::RemoveLast(RepeatedField<long> *this)

{
  int v1;
  int v2;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  int old_size;
  bool is_soo;
  RepeatedField<long> *this_local;
  
  _old_size = this;
  absl_log_internal_check_op_result._7_1_ = RepeatedField<long>::is_soo(this);
  absl_log_internal_check_op_result._0_4_ = size(this,(bool)absl_log_internal_check_op_result._7_1_)
  ;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue
                 ((int)absl_log_internal_check_op_result);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_(v1,v2,"old_size > 0");
  if (local_20 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x3bb,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  elements(this,(bool)(absl_log_internal_check_op_result._7_1_ & 1));
  ExchangeCurrentSize(this,(bool)(absl_log_internal_check_op_result._7_1_ & 1),
                      (int)absl_log_internal_check_op_result + -1);
  return;
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}